

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSO.h
# Opt level: O3

pair<std::vector<double,_std::allocator<double>_>,_double> * __thiscall
PSO::optimize(pair<std::vector<double,_std::allocator<double>_>,_double> *__return_storage_ptr__,
             PSO *this,
             function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
             *fitFunc)

{
  int iVar1;
  double *pdVar2;
  pointer pdVar3;
  pair<std::vector<double,_std::allocator<double>_>,_double> *this_00;
  ulong uVar4;
  ostream *this_01;
  long *plVar5;
  undefined8 uVar6;
  size_t __i;
  long lVar7;
  double *col;
  double *__args;
  vector<double,_std::allocator<double>_> *__range2;
  pointer pvVar8;
  pointer pdVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  vector<double,_std::allocator<double>_> temp;
  vector<double,_std::allocator<double>_> globalBest;
  vector<double,_std::allocator<double>_> localBest;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  particles;
  vector<double,_std::allocator<double>_> velocity;
  Environment ENV;
  mt19937 mersenne;
  allocator_type local_15b9;
  double local_15b8;
  double local_15b0;
  vector<double,_std::allocator<double>_> local_15a8;
  double local_1590;
  vector<double,_std::allocator<double>_> local_1580;
  vector<double,_std::allocator<double>_> local_1568;
  double local_1550;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1548;
  Point_<int> local_1528;
  Point_<int> local_1520;
  Point_<int> local_1518;
  Point_<int> local_1510;
  Point_<int> local_1508;
  Point_<int> local_1500;
  Point_<int> local_14f8;
  Point_<int> local_14f0;
  Point_<int> local_14e8;
  vector<double,_std::allocator<double>_> local_14e0;
  vector<double,_std::allocator<double>_> local_14c8;
  pair<std::vector<double,_std::allocator<double>_>,_double> *local_14b0;
  pointer local_14a8;
  double local_14a0;
  vector<double,_std::allocator<double>_> local_1498;
  vector<double,_std::allocator<double>_> local_1480;
  vector<double,_std::allocator<double>_> local_1468;
  vector<double,_std::allocator<double>_> local_1450;
  vector<double,_std::allocator<double>_> local_1438;
  vector<double,_std::allocator<double>_> local_1420;
  vector<double,_std::allocator<double>_> local_1408;
  Environment local_13f0;
  vector<double,_std::allocator<double>_> local_13e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_13d0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_14b0 = __return_storage_ptr__;
  Environment::Environment(&local_13f0);
  local_13b8._M_x[0] = time((time_t *)0x0);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffff;
  lVar7 = 1;
  uVar4 = local_13b8._M_x[0];
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar7);
    local_13b8._M_x[lVar7] = uVar4;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  local_13b8._M_p = 0x270;
  local_15b8 = this->minRand;
  local_15b0 = this->maxRand;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1568,(long)this->numberOfDimensions,(allocator_type *)&local_15a8);
  pdVar3 = local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    local_1550 = local_15b0 - local_15b8;
    pdVar9 = local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      dVar11 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *pdVar9 = dVar11 * local_1550 + local_15b8;
      pdVar9 = pdVar9 + 1;
    } while (pdVar9 != pdVar3);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1580,(long)this->numberOfDimensions,(allocator_type *)&local_15a8);
  std::vector<double,_std::allocator<double>_>::operator=(&local_1580,&local_1568);
  local_1548.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1548.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1548.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = this->numberOfParticles;
  local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_15a8,(long)this->numberOfDimensions,(value_type_conflict *)&local_14c8,
             &local_15b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&local_1548,(long)iVar1,&local_15a8);
  if (local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_14c8,(long)this->numberOfDimensions,(value_type_conflict *)&local_15a8);
  local_14a8 = local_1548.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1548.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1548.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_15b0 = local_15b0 - local_15b8;
    pvVar8 = local_1548.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_15a8,(long)this->numberOfDimensions,&local_15b9);
      if (local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      pdVar2 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (__args = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start; __args != pdVar2; __args = __args + 1) {
        dVar11 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (&local_13b8);
        dVar11 = dVar11 * local_15b0 + local_15b8;
        *__args = dVar11;
        if (local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_15a8,
                     (iterator)
                     local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,__args);
        }
        else {
          *local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = dVar11;
          local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if (local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      std::vector<double,_std::allocator<double>_>::operator=(&local_1568,&local_15a8);
      std::vector<double,_std::allocator<double>_>::vector(&local_1408,&local_1568);
      local_14e8.x = local_13f0.goal.x;
      local_14e8.y = local_13f0.goal.y;
      if ((fitFunc->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001031f6;
      local_1550 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_1408,&local_14e8);
      std::vector<double,_std::allocator<double>_>::vector(&local_13e8,&local_1580);
      local_14f0.x = local_13f0.goal.x;
      local_14f0.y = local_13f0.goal.y;
      if ((fitFunc->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001031fb;
      local_14a0 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_13e8,&local_14f0);
      if (local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_13e8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_1408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1408.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_1408.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_1550 < local_14a0) {
        if (local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<double,_std::allocator<double>_>::operator=(&local_1580,&local_1568);
      }
      if (local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 != local_14a8);
  }
  dVar11 = 0.0;
  while( true ) {
    std::vector<double,_std::allocator<double>_>::vector(&local_14e0,&local_1580);
    local_14f8.x = local_13f0.goal.x;
    local_14f8.y = local_13f0.goal.y;
    if ((fitFunc->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    dVar12 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_14e0,&local_14f8);
    if (dVar12 < this->errorCon || dVar12 == this->errorCon) {
      if (local_14e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_14e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_14e0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_14e0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
LAB_00102f87:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Goal Point Is : ",0x10);
      this_01 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_13f0.goal.x);
      std::__ostream_insert<char,std::char_traits<char>>(this_01," , ",3);
      plVar5 = (long *)std::ostream::operator<<(this_01,local_13f0.goal.y);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      std::vector<double,_std::allocator<double>_>::vector(&local_1480,&local_1580);
      local_1520.x = local_13f0.goal.x;
      local_1520.y = local_13f0.goal.y;
      if ((fitFunc->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0010320f;
      local_15b8 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_1480,&local_1520);
      std::vector<double,_std::allocator<double>_>::vector(&local_15a8,&local_1580);
      local_1590 = local_15b8;
      pdVar3 = (this->result).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->result).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->result).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->result).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->result).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      if (pdVar3 == (pointer)0x0) {
        (this->result).second = local_15b8;
      }
      else {
        operator_delete(pdVar3,(long)pdVar9 - (long)pdVar3);
        (this->result).second = local_1590;
        if (local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_15a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_15a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_15a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      this_00 = local_14b0;
      if (local_1480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1480.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_1480.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      std::vector<double,_std::allocator<double>_>::vector(&local_1498,&local_1580);
      local_1528.x = local_13f0.goal.x;
      local_1528.y = local_13f0.goal.y;
      if ((fitFunc->super__Function_base)._M_manager != (_Manager_type)0x0) {
        local_15b8 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_1498,&local_1528);
        std::vector<double,_std::allocator<double>_>::vector(&this_00->first,&local_1580);
        this_00->second = local_15b8;
        if (local_1498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1498.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1498.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_14c8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_14c8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_1548);
        if (local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1580.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1580.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1568.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1568.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return this_00;
      }
      goto LAB_00103214;
    }
    iVar1 = this->maximumOfIteration;
    if (local_14e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_14e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_14e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_14e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (iVar1 <= SUB84(dVar11,0)) goto LAB_00102f87;
    local_1550 = dVar11;
    if (0 < this->numberOfParticles) {
      lVar7 = 0;
      do {
        if (0 < this->numberOfDimensions) {
          lVar10 = 0;
          do {
            local_15b8 = std::
                         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                   (&local_13b8);
            dVar11 = std::
                     generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                               (&local_13b8);
            pdVar3 = local_1548.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar7].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar11 = (local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10] - pdVar3[lVar10]) *
                     (dVar11 + 0.0) * this->C2 +
                     this->W * local_14c8.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar10] +
                     (local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10] - pdVar3[lVar10]) *
                     (local_15b8 + 0.0) * this->C1;
            local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] = dVar11;
            pdVar3[lVar10] = dVar11 + pdVar3[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 < this->numberOfDimensions);
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_1420,
                   local_1548.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar7);
        local_1500.x = local_13f0.goal.x;
        local_1500.y = local_13f0.goal.y;
        if ((fitFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001031f1:
          std::__throw_bad_function_call();
          goto LAB_001031f6;
        }
        local_15b8 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_1420,&local_1500);
        std::vector<double,_std::allocator<double>_>::vector(&local_1438,&local_1568);
        local_1508.x = local_13f0.goal.x;
        local_1508.y = local_13f0.goal.y;
        if ((fitFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
          goto LAB_001031f1;
        }
        local_15b0 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_1438,&local_1508);
        if (local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1438.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1438.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1420.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1420.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1420.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1420.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_15b8 < local_15b0) {
          if (local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          std::vector<double,_std::allocator<double>_>::operator=
                    (&local_1568,
                     local_1548.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar7);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->numberOfParticles);
    }
    std::vector<double,_std::allocator<double>_>::vector(&local_1450,&local_1568);
    dVar11 = local_1550;
    local_1510.x = local_13f0.goal.x;
    local_1510.y = local_13f0.goal.y;
    if ((fitFunc->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00103205;
    local_15b8 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_1450,&local_1510);
    std::vector<double,_std::allocator<double>_>::vector(&local_1468,&local_1580);
    local_1518.x = local_13f0.goal.x;
    local_1518.y = local_13f0.goal.y;
    if ((fitFunc->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0010320a;
    local_15b0 = (*fitFunc->_M_invoker)((_Any_data *)fitFunc,&local_1468,&local_1518);
    if (local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1450.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_15b8 < local_15b0) {
      if (local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      std::vector<double,_std::allocator<double>_>::operator=(&local_1580,&local_1568);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_13d0,&local_1548);
    Environment::Update(&local_13f0,&local_13d0);
    dVar11 = (double)(ulong)(SUB84(dVar11,0) + 1);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_13d0);
  }
LAB_00103200:
  std::__throw_bad_function_call();
LAB_00103205:
  std::__throw_bad_function_call();
LAB_0010320a:
  std::__throw_bad_function_call();
LAB_0010320f:
  std::__throw_bad_function_call();
LAB_00103214:
  uVar6 = std::__throw_bad_function_call();
  if (local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_14c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1548);
  if (local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1580.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (double *)0x0) {
    operator_delete(local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1568.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar6);
LAB_001031f6:
  std::__throw_bad_function_call();
LAB_001031fb:
  std::__throw_bad_function_call();
  goto LAB_00103200;
}

Assistant:

auto optimize( function<double (vector<double>, Point )> fitFunc )
    {
        // Set A Instance From Environment And Get Goal Position
        Environment ENV;
        auto goal = ENV.getGoal();

        mt19937 mersenne( static_cast<unsigned int>( time( nullptr ) ) );
        uniform_real_distribution<> rnd1( minRand, maxRand );
        uniform_real_distribution<> rnd2( 0, 1 );

        vector<double> localBest( numberOfDimensions );
        generate( localBest.begin(), localBest.end(), [&]{ return rnd1( mersenne );} );

        vector<double> globalBest( numberOfDimensions );
        globalBest = localBest;

        vector <vector<double> > particles;
        particles.resize( numberOfParticles, vector<double>( numberOfDimensions, 0 ) );

        vector<double> velocity;
        velocity.resize( numberOfDimensions, 0 );

        for ( auto &row : particles )
        {
            vector<double> temp( numberOfDimensions );
            temp.clear();

            for ( auto &col : row )
            {
                col = rnd1( mersenne );
                temp.push_back( col );
            }

            localBest.clear();
            localBest = temp;

            if ( fitFunc( localBest, goal ) < fitFunc( globalBest, goal ) )
            {
                globalBest.clear();
                globalBest = localBest;
            }
        }

        int iterator = 0;
        while ( fitFunc( globalBest, goal ) > errorCon and iterator < maximumOfIteration )
        {
            ++iterator;
            for ( int i = 0; i < numberOfParticles; ++i )
            {
                for ( int j = 0; j < numberOfDimensions; ++j )
                {
                    double r1 = rnd2( mersenne );
                    double r2 = rnd2( mersenne );

                    velocity[j] = W * velocity[j] 
                                    + ( C1 * r1 * ( localBest[j]  - particles[i][j] ) )
                                    + ( C2 * r2 * ( globalBest[j] - particles[i][j] ) );

                    particles[i][j] = particles[i][j] + velocity[j];
                }

                if ( fitFunc( particles[i], goal ) < fitFunc( localBest, goal ) )
                {
                    localBest.clear();
                    localBest = particles[i];
                }
            }

            if ( fitFunc( localBest, goal ) < fitFunc( globalBest, goal ) )
            {
                globalBest.clear();
                globalBest = localBest;
            }
            
            // Update Monitor
            ENV.Update( particles );
        }

        // Print Goal Position
        cout<<"Goal Point Is : "<<goal.x<<" , "<<goal.y<<endl;

        this->result = make_pair( globalBest, fitFunc(globalBest, goal) );
        return make_pair( globalBest, fitFunc(globalBest, goal) );

    }